

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  bool bVar31;
  int iVar32;
  uint uVar33;
  undefined4 extraout_EAX;
  int iVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  Mat *dst;
  float *pfVar42;
  long lVar43;
  uint uVar44;
  ulong uVar45;
  uint uVar46;
  bool bVar47;
  long lVar48;
  float *pfVar49;
  long lVar50;
  float *pfVar51;
  Option *opt_00;
  ulong uVar52;
  int iVar53;
  float fVar54;
  int iVar56;
  uint _h;
  float fVar57;
  float fVar58;
  undefined1 auVar55 [16];
  float fVar59;
  long local_310;
  ulong local_308;
  float *local_2f8;
  Mat local_2a8;
  Option *local_258;
  Mat *local_250;
  Mat local_248;
  Mat *local_200;
  size_t local_1f8;
  Mat *local_1f0;
  undefined1 local_1e8 [64];
  size_t local_1a8;
  undefined1 local_198 [32];
  undefined8 local_178;
  float afStack_170 [2];
  undefined1 auStack_168 [12];
  size_t local_158;
  uint local_148;
  uint uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  float local_138 [66];
  
  iVar36 = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  iVar37 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  iVar38 = top_blob->c;
  local_248.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_248.refcount._0_4_ = SUB84(piVar6,0);
  local_248.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_248.allocator = bottom_blob->allocator;
  uVar23 = bottom_blob->dims;
  uVar24 = bottom_blob->w;
  uVar25 = bottom_blob->h;
  uVar26 = bottom_blob->d;
  iVar32 = bottom_blob->w;
  iVar34 = bottom_blob->h;
  local_248.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
    iVar32 = bottom_blob->w;
    iVar34 = bottom_blob->h;
  }
  iVar53 = uVar1 + 1;
  iVar56 = uVar3 + 1;
  uVar46 = iVar53 - (iVar53 >> 0x1f) & 0xfffffffe;
  _h = iVar56 - (iVar56 >> 0x1f) & 0xfffffffe;
  uStack_140 = 0;
  uStack_13c = 0;
  local_248.elemsize = sVar5;
  local_248.elempack = iVar37;
  local_248.dims = uVar23;
  local_248.w = uVar24;
  local_248.h = uVar25;
  local_248.d = uVar26;
  local_248.c = iVar36;
  local_200 = bias;
  local_1f0 = kernel_tm;
  local_148 = uVar46;
  uStack_144 = _h;
  copy_make_border(bottom_blob,&local_248,0,(_h - iVar34) + 2,0,(uVar46 - iVar32) + 2,0,0.0,opt);
  local_1a8 = 0;
  local_1e8._0_8_ = (void *)0x0;
  local_1e8._8_4_ = 0;
  local_1e8._12_4_ = 0;
  local_1e8._16_8_ = 0;
  local_1e8._24_4_ = 0;
  local_1e8._32_8_ = (Allocator *)0x0;
  local_1e8._40_4_ = 0;
  local_1e8._44_4_ = 0;
  local_1e8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_258 = opt;
  local_250 = top_blob;
  local_1f8 = sVar5;
  Mat::create((Mat *)local_1e8,(iVar56 / 2) * (iVar53 / 2),0x10,iVar36,sVar5,iVar37,
              opt->workspace_allocator);
  sVar5 = local_1f8;
  dst = local_250;
  opt_00 = local_258;
  if (0 < (long)local_248.c) {
    uVar44 = (local_248.h - (local_248.h + -2 >> 0x1f)) + -2 >> 1;
    uVar33 = (local_248.w - (local_248.w + -2 >> 0x1f)) + -2 >> 1;
    iVar36 = uVar33 * uVar44;
    uVar52 = 1;
    if (1 < (int)uVar33) {
      uVar52 = (ulong)uVar33;
    }
    if ((int)uVar44 < 2) {
      uVar44 = 1;
    }
    local_310 = 0;
    do {
      if (3 < local_248.h) {
        pfVar49 = (float *)((long)local_248.data +
                           local_248.elemsize * local_248.cstep * local_310 + 0x30);
        lVar48 = local_1e8._16_8_ * local_1a8 * local_310;
        lVar50 = 0;
        uVar40 = 0;
        do {
          if (3 < local_248.w) {
            uVar45 = 0;
            lVar35 = lVar50;
            pfVar51 = pfVar49;
            do {
              lVar41 = -0x40;
              pfVar42 = pfVar51;
              do {
                fVar54 = pfVar42[-0xb];
                fVar57 = pfVar42[-10];
                fVar58 = pfVar42[-9];
                fVar59 = pfVar42[-8];
                fVar8 = pfVar42[-7];
                fVar9 = pfVar42[-6];
                fVar10 = pfVar42[-5];
                fVar11 = pfVar42[-4];
                fVar12 = pfVar42[-3];
                fVar13 = pfVar42[-2];
                fVar14 = pfVar42[-1];
                fVar15 = *pfVar42;
                fVar16 = pfVar42[1];
                fVar17 = pfVar42[2];
                fVar18 = pfVar42[3];
                *(float *)((long)local_138 + lVar41 + 0x40) = pfVar42[-0xc] - fVar11;
                *(float *)((long)local_138 + lVar41 + 0x44) = fVar54 - fVar12;
                *(float *)((long)local_138 + lVar41 + 0x48) = fVar57 - fVar13;
                *(float *)((long)local_138 + lVar41 + 0x4c) = fVar58 - fVar14;
                *(float *)((long)local_138 + lVar41 + 0x80) = fVar11 + fVar59;
                *(float *)((long)local_138 + lVar41 + 0x84) = fVar12 + fVar8;
                *(float *)((long)local_138 + lVar41 + 0x88) = fVar13 + fVar9;
                *(float *)((long)local_138 + lVar41 + 0x8c) = fVar14 + fVar10;
                *(float *)((long)local_138 + lVar41 + 0xc0) = fVar11 - fVar59;
                *(float *)((long)local_138 + lVar41 + 0xc4) = fVar12 - fVar8;
                *(float *)((long)local_138 + lVar41 + 200) = fVar13 - fVar9;
                *(float *)((long)local_138 + lVar41 + 0xcc) = fVar14 - fVar10;
                *(float *)((long)local_138 + lVar41 + 0x100) = fVar15 - fVar59;
                *(float *)((long)local_138 + lVar41 + 0x104) = fVar16 - fVar8;
                *(float *)(&stack0xffffffffffffffd0 + lVar41) = fVar17 - fVar9;
                *(float *)(&stack0xffffffffffffffd4 + lVar41) = fVar18 - fVar10;
                pfVar42 = pfVar42 + local_248.w * 4;
                lVar41 = lVar41 + 0x10;
              } while (lVar41 != 0);
              lVar43 = 0;
              lVar41 = lVar35;
              do {
                fVar54 = *(float *)((long)local_138 + lVar43 + 4);
                fVar57 = *(float *)((long)local_138 + lVar43 + 8);
                fVar58 = *(float *)((long)local_138 + lVar43 + 0xc);
                fVar59 = *(float *)((long)local_138 + lVar43 + 0x10);
                fVar8 = *(float *)((long)local_138 + lVar43 + 0x14);
                fVar9 = *(float *)((long)local_138 + lVar43 + 0x18);
                fVar10 = *(float *)((long)local_138 + lVar43 + 0x1c);
                fVar11 = *(float *)((long)local_138 + lVar43 + 0x20);
                fVar12 = *(float *)((long)local_138 + lVar43 + 0x24);
                fVar13 = *(float *)((long)local_138 + lVar43 + 0x28);
                fVar14 = *(float *)((long)local_138 + lVar43 + 0x2c);
                fVar15 = *(float *)((long)local_138 + lVar43 + 0x30);
                fVar16 = *(float *)((long)local_138 + lVar43 + 0x34);
                fVar17 = *(float *)((long)local_138 + lVar43 + 0x38);
                fVar18 = *(float *)((long)local_138 + lVar43 + 0x3c);
                pfVar42 = (float *)(local_1e8._0_8_ + lVar41 + lVar48);
                *pfVar42 = *(float *)((long)local_138 + lVar43) - fVar11;
                pfVar42[1] = fVar54 - fVar12;
                pfVar42[2] = fVar57 - fVar13;
                pfVar42[3] = fVar58 - fVar14;
                pfVar42 = (float *)(local_1e8._0_8_ + lVar41 + (long)(iVar36 * 4) * 4 + lVar48);
                *pfVar42 = fVar11 + fVar59;
                pfVar42[1] = fVar12 + fVar8;
                pfVar42[2] = fVar13 + fVar9;
                pfVar42[3] = fVar14 + fVar10;
                pfVar42 = (float *)(local_1e8._0_8_ + lVar41 + (long)(iVar36 * 8) * 4 + lVar48);
                *pfVar42 = fVar11 - fVar59;
                pfVar42[1] = fVar12 - fVar8;
                pfVar42[2] = fVar13 - fVar9;
                pfVar42[3] = fVar14 - fVar10;
                pfVar42 = (float *)(local_1e8._0_8_ + lVar41 + (long)(iVar36 * 0xc) * 4 + lVar48);
                *pfVar42 = fVar15 - fVar59;
                pfVar42[1] = fVar16 - fVar8;
                pfVar42[2] = fVar17 - fVar9;
                pfVar42[3] = fVar18 - fVar10;
                lVar43 = lVar43 + 0x40;
                lVar41 = lVar41 + (long)(iVar36 * 0x10) * 4;
              } while (lVar43 != 0x100);
              uVar45 = uVar45 + 1;
              pfVar51 = pfVar51 + 8;
              lVar35 = lVar35 + 0x10;
            } while (uVar45 != uVar52);
          }
          uVar40 = uVar40 + 1;
          pfVar49 = (float *)((long)pfVar49 + (long)local_248.w * local_248.elemsize * 2);
          lVar50 = lVar50 + (long)(int)uVar33 * 0x10;
        } while (uVar40 != uVar44);
      }
      local_310 = local_310 + 1;
    } while (local_310 != local_248.c);
  }
  piVar6 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (**(code **)(*(long *)local_248.allocator + 0x18))();
      }
    }
  }
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_158 = 0;
  local_198._0_8_ = (void *)0x0;
  local_198._8_4_ = 0;
  local_198._12_4_ = 0;
  local_198._16_8_ = 0;
  local_198._24_4_ = 0;
  local_178 = (Allocator *)0x0;
  afStack_170[0] = 0.0;
  afStack_170[1] = 0.0;
  auStack_168 = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_pack4_sse((Mat *)local_1e8,iVar38,local_1f0,(Mat *)local_198,opt_00);
  local_2a8.cstep = 0;
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize = 0;
  local_2a8.elempack = 0;
  local_2a8.allocator = (Allocator *)0x0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  uVar2 = dst->w;
  uVar4 = dst->h;
  auVar55._4_4_ = -(uint)(local_148 == uVar2);
  auVar55._0_4_ = -(uint)(local_148 == uVar2);
  auVar55._8_4_ = -(uint)(uStack_144 == uVar4);
  auVar55._12_4_ = -(uint)(uStack_144 == uVar4);
  iVar36 = movmskpd(extraout_EAX,auVar55);
  if (iVar36 == 3) {
    if (&local_2a8 == dst) {
      iVar38 = 0;
      iVar32 = 0;
      goto LAB_0019cfa3;
    }
    piVar6 = dst->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_2a8.data = dst->data;
    local_2a8.refcount._0_4_ = SUB84(dst->refcount,0);
    local_2a8.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_2a8.elemsize = dst->elemsize;
    local_2a8.elempack = dst->elempack;
    local_2a8.allocator = dst->allocator;
    uVar27 = dst->dims;
    uVar28 = dst->w;
    uVar29 = dst->h;
    uVar30 = dst->d;
    local_2a8.c = dst->c;
    local_2a8.cstep = dst->cstep;
    iVar37 = dst->h;
    iVar36 = dst->w;
    local_2a8.dims = uVar27;
    local_2a8.w = uVar28;
    local_2a8.h = uVar29;
    local_2a8.d = uVar30;
  }
  else {
    Mat::create(&local_2a8,uVar46,_h,iVar38,sVar5,iVar37,opt_00->workspace_allocator);
    iVar37 = local_2a8.h;
    iVar36 = local_2a8.w;
  }
  iVar38 = iVar37;
  iVar32 = iVar36;
  if (0 < local_2a8.c) {
    pvVar7 = local_200->data;
    uVar46 = iVar36 / 2;
    iVar34 = uVar46 * (iVar37 / 2);
    uVar52 = 0;
    do {
      if (pvVar7 == (void *)0x0) {
        fVar54 = 0.0;
        fVar57 = 0.0;
        fVar58 = 0.0;
        fVar59 = 0.0;
      }
      else {
        pfVar49 = (float *)((long)pvVar7 + uVar52 * 0x10);
        fVar54 = *pfVar49;
        fVar57 = pfVar49[1];
        fVar58 = pfVar49[2];
        fVar59 = pfVar49[3];
      }
      if (1 < iVar37) {
        local_2f8 = (float *)((long)local_2a8.data +
                             local_2a8.elemsize * local_2a8.cstep * uVar52 + 0x10);
        local_308 = 0;
        uVar40 = 0;
        do {
          if (1 < iVar36) {
            uVar39 = 0;
            pfVar49 = local_2f8;
            uVar45 = local_308;
            do {
              pfVar51 = (float *)(local_198._0_8_ +
                                 (uVar45 >> 2 & 0x3fffffff) * 0x10 +
                                 local_198._16_8_ * local_158 * uVar52);
              lVar48 = 0x40;
              do {
                pfVar42 = pfVar51 + iVar34 * 4;
                fVar8 = *pfVar42;
                fVar9 = pfVar42[1];
                fVar10 = pfVar42[2];
                fVar11 = pfVar42[3];
                pfVar42 = pfVar51 + iVar34 * 8;
                fVar12 = *pfVar42;
                fVar13 = pfVar42[1];
                fVar14 = pfVar42[2];
                fVar15 = pfVar42[3];
                fVar16 = pfVar51[1];
                fVar17 = pfVar51[2];
                fVar18 = pfVar51[3];
                pfVar42 = pfVar51 + iVar34 * 0xc;
                fVar19 = *pfVar42;
                fVar20 = pfVar42[1];
                fVar21 = pfVar42[2];
                fVar22 = pfVar42[3];
                *(float *)((long)&local_178 + lVar48) = *pfVar51 + fVar8 + fVar12;
                *(float *)((long)&local_178 + lVar48 + 4) = fVar16 + fVar9 + fVar13;
                *(float *)((long)afStack_170 + lVar48) = fVar17 + fVar10 + fVar14;
                *(float *)(auStack_168 + lVar48 + -4) = fVar18 + fVar11 + fVar15;
                *(float *)((long)local_138 + lVar48) = (fVar8 - fVar12) + fVar19;
                *(float *)((long)local_138 + lVar48 + 4) = (fVar9 - fVar13) + fVar20;
                *(float *)((long)local_138 + lVar48 + 8) = (fVar10 - fVar14) + fVar21;
                *(float *)((long)local_138 + lVar48 + 0xc) = (fVar11 - fVar15) + fVar22;
                lVar48 = lVar48 + 0x10;
                pfVar51 = pfVar51 + iVar34 * 0x10;
              } while (lVar48 != 0x80);
              pfVar51 = local_138;
              pfVar42 = pfVar49;
              bVar31 = true;
              do {
                bVar47 = bVar31;
                fVar8 = pfVar51[8];
                fVar9 = pfVar51[9];
                fVar10 = pfVar51[10];
                fVar11 = pfVar51[0xb];
                fVar12 = pfVar51[4];
                fVar13 = pfVar51[5];
                fVar14 = pfVar51[6];
                fVar15 = pfVar51[7];
                fVar16 = pfVar51[1];
                fVar17 = pfVar51[2];
                fVar18 = pfVar51[3];
                fVar19 = pfVar51[0xc];
                fVar20 = pfVar51[0xd];
                fVar21 = pfVar51[0xe];
                fVar22 = pfVar51[0xf];
                pfVar42[-4] = *pfVar51 + fVar12 + fVar54 + fVar8;
                pfVar42[-3] = fVar16 + fVar13 + fVar57 + fVar9;
                pfVar42[-2] = fVar17 + fVar14 + fVar58 + fVar10;
                pfVar42[-1] = fVar18 + fVar15 + fVar59 + fVar11;
                *pfVar42 = ((fVar12 + fVar54) - fVar8) + fVar19;
                pfVar42[1] = ((fVar13 + fVar57) - fVar9) + fVar20;
                pfVar42[2] = ((fVar14 + fVar58) - fVar10) + fVar21;
                pfVar42[3] = ((fVar15 + fVar59) - fVar11) + fVar22;
                pfVar42 = pfVar42 + iVar36 * 4;
                pfVar51 = local_138 + 0x10;
                bVar31 = false;
              } while (bVar47);
              uVar39 = uVar39 + 1;
              uVar45 = uVar45 + 4;
              pfVar49 = pfVar49 + 8;
            } while (uVar39 != uVar46);
          }
          uVar40 = uVar40 + 1;
          local_308 = local_308 + (ulong)uVar46 * 4;
          local_2f8 = (float *)((long)local_2f8 + (long)local_2a8.w * local_2a8.elemsize * 2);
        } while (uVar40 != (uint)(iVar37 / 2));
      }
      uVar52 = uVar52 + 1;
      dst = local_250;
      opt_00 = local_258;
      iVar38 = local_2a8.h;
      iVar32 = local_2a8.w;
    } while (uVar52 != (uint)local_2a8.c);
  }
LAB_0019cfa3:
  copy_cut_border(&local_2a8,dst,0,iVar38 - dst->h,0,iVar32 - dst->w,opt_00);
  piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_2a8.allocator == (Allocator *)0x0) {
        if (local_2a8.data != (void *)0x0) {
          free(local_2a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_2a8.allocator + 0x18))();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_178 == (Allocator *)0x0) {
        if ((void *)local_198._0_8_ != (void *)0x0) {
          free((void *)local_198._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_178 + 0x18))();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_1e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1e8._0_8_ != (void *)0x0) {
          free((void *)local_1e8._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_1e8._32_8_ + 0x18))();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (**(code **)(*(long *)local_248.allocator + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}